

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

char * __thiscall timing::elapsed_time_readable(timing *this)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  int runtime_seconds;
  int runtime_minutes;
  int runtime_hours;
  int delta_time;
  double diff_time;
  timing *in_stack_fffffffffffffff0;
  
  dVar2 = elapsed_time_seconds(in_stack_fffffffffffffff0);
  iVar1 = (int)dVar2;
  sprintf((char *)(in_RDI + 0x28),"%ih:%im:%is",(ulong)(uint)(iVar1 / 0xe10),
          (long)((ulong)(uint)((int)((long)iVar1 % 0xe10) >> 0x1f) << 0x20 |
                (long)iVar1 % 0xe10 & 0xffffffffU) / 0x3c & 0xffffffff,
          (long)((ulong)(uint)((int)((long)iVar1 % 0xe10) >> 0x1f) << 0x20 |
                (long)iVar1 % 0xe10 & 0xffffffffU) % 0x3c & 0xffffffff);
  return (char *)(in_RDI + 0x28);
}

Assistant:

char *timing::elapsed_time_readable(){

    double diff_time=elapsed_time_seconds();
    int delta_time=int(diff_time);

    int runtime_hours=delta_time/3600;
    int runtime_minutes=(delta_time % 3600)/60;
    int runtime_seconds=(delta_time % 3600)%60;
    sprintf(runtime,"%ih:%im:%is",runtime_hours,runtime_minutes,runtime_seconds);

    return runtime;

}